

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.c
# Opt level: O0

void * log_1(void *p)

{
  int iVar1;
  int line2;
  char *func2;
  char *file2;
  int line1;
  char *func1;
  char *file1;
  int local_34;
  char **in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  
  zt_log_set_debug_info
            ((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc,(char *)in_stack_ffffffffffffffd0);
  iVar2 = 0x8b;
  zt_log_get_debug_info
            ((char **)CONCAT44(0x8b,in_stack_ffffffffffffffe0),
             (int *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd0);
  zt_log_lprintf((zt_log_ty *)0x0,zt_log_err,"test1");
  iVar1 = strcmp("/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/log_test.c"
                 ,(char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (iVar1 == 0) {
    iVar1 = strcmp("log_1",(char *)in_stack_ffffffffffffffd0);
    if ((iVar1 == 0) && (iVar2 == local_34)) {
      _count1 = _count1 + 1;
    }
  }
  return (void *)0x0;
}

Assistant:

void *
log_1(void * p) {
    const char * file1;
    const char * func1;
    int          line1;
    const char * file2;
    const char * func2;
    int          line2;

    ZT_LOG_DEBUG_INFO(), file1 = __FILE__, line1 = __LINE__, func1 = ZT_LOG_FUNCTION;
    zt_log_get_debug_info( &file2, &line2, &func2);
    zt_log_printf(zt_log_err, "test1");

    if ((strcmp(file1, file2) == 0) &&
        (strcmp(func1, func2) == 0) &&
        line1 == line2) {
        _count1++;
    }

    return NULL;
}